

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O0

int __thiscall
flow::BrInstr::clone(BrInstr *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  unique_ptr<flow::BrInstr,_std::default_delete<flow::BrInstr>_> local_20;
  __fn *local_18;
  BrInstr *this_local;
  
  local_18 = __fn;
  this_local = this;
  targetBlock((BrInstr *)__fn);
  std::make_unique<flow::BrInstr,flow::BasicBlock*>((BasicBlock **)&local_20);
  std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>::
  unique_ptr<flow::BrInstr,std::default_delete<flow::BrInstr>,void>
            ((unique_ptr<flow::Instr,std::default_delete<flow::Instr>> *)this,&local_20);
  std::unique_ptr<flow::BrInstr,_std::default_delete<flow::BrInstr>_>::~unique_ptr(&local_20);
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> BrInstr::clone() {
  return std::make_unique<BrInstr>(targetBlock());
}